

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_callback.cpp
# Opt level: O0

void notify_callback(result *res,vector<int,_std::allocator<int>_> *v)

{
  bool bVar1;
  reference piVar2;
  ostream *poVar3;
  int *x;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  vector<int,_std::allocator<int>_> *v_local;
  result *res_local;
  
  nonstd::result::get();
  __end1 = std::vector<int,_std::allocator<int>_>::begin(v);
  x = (int *)std::vector<int,_std::allocator<int>_>::end(v);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                               &x);
    if (!bVar1) break;
    piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar2);
    std::operator<<(poVar3,"->");
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"print job done\n");
  return;
}

Assistant:

void notify_callback(nonstd::result &res, std::vector<int> &v)
{
   res.get();
   //print
   for (auto &x: v)
     {
        std::cout << x << "->";
     }
   std::cout << std::endl;
   std::cout << "print job done\n";
}